

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O3

void __thiscall
Statsd::StatsdClient::setConfig
          (StatsdClient *this,string *host,uint16_t port,string *prefix,uint64_t batchsize,
          uint64_t sendInterval,int gaugePrecision)

{
  pointer pcVar1;
  UDPSender *__ptr;
  UDPSender *this_00;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  string *local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_78 = local_68;
  local_58 = host;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + prefix->_M_string_length);
  if ((local_70 != 0) && (local_78[local_70 + -1] == '.')) {
    std::__cxx11::string::pop_back();
  }
  local_50 = local_78;
  if (local_78 == local_68) {
    uStack_38 = uStack_60;
    local_50 = local_40;
  }
  local_48 = local_70;
  local_70 = 0;
  local_68[0] = 0;
  local_78 = local_68;
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  this_00 = (UDPSender *)operator_new(0xf0);
  UDPSender::UDPSender(this_00,local_58,port,batchsize,sendInterval);
  __ptr = (this->m_sender)._M_t.
          super___uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>._M_t.
          super__Tuple_impl<0UL,_Statsd::UDPSender_*,_std::default_delete<Statsd::UDPSender>_>.
          super__Head_base<0UL,_Statsd::UDPSender_*,_false>._M_head_impl;
  (this->m_sender)._M_t.
  super___uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>._M_t.
  super__Tuple_impl<0UL,_Statsd::UDPSender_*,_std::default_delete<Statsd::UDPSender>_>.
  super__Head_base<0UL,_Statsd::UDPSender_*,_false>._M_head_impl = this_00;
  if (__ptr != (UDPSender *)0x0) {
    std::default_delete<Statsd::UDPSender>::operator()
              ((default_delete<Statsd::UDPSender> *)&this->m_sender,__ptr);
  }
  this->m_gaugePrecision = gaugePrecision;
  return;
}

Assistant:

inline void StatsdClient::setConfig(const std::string& host,
                                    const uint16_t port,
                                    const std::string& prefix,
                                    const uint64_t batchsize,
                                    const uint64_t sendInterval,
                                    const int gaugePrecision) noexcept {
    m_prefix = detail::sanitizePrefix(prefix);
    m_sender.reset(new UDPSender(host, port, batchsize, sendInterval));
    m_gaugePrecision = gaugePrecision;
}